

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O2

bool __thiscall
boost::system::error_category::std_category::equivalent
          (std_category *this,int code,error_condition *condition)

{
  error_category *peVar1;
  bool bVar2;
  int iVar3;
  error_category *peVar4;
  long lVar5;
  error_category *extraout_RDX;
  int iVar6;
  error_condition bn;
  error_code bc;
  error_condition local_50;
  error_code local_40;
  
  iVar3 = (**(code **)(*(long *)this + 0x28))();
  peVar1 = condition->_M_cat;
  iVar6 = condition->_M_value;
  if (extraout_RDX == peVar1 && iVar3 == iVar6) {
    return true;
  }
  peVar4 = (error_category *)std::_V2::generic_category();
  local_40.m_val = code;
  if (peVar1 != peVar4) {
    generic_category();
    if ((std_category *)peVar1 !=
        &generic_category::generic_category_const.super_error_category.std_cat_) {
      lVar5 = __dynamic_cast(condition->_M_cat,&std::_V2::error_category::typeinfo,&typeinfo,0);
      if (lVar5 == 0) {
        return false;
      }
      local_40.m_cat = this->pc_;
      local_50.m_cat = *(error_category **)(lVar5 + 8);
      local_50.m_val = condition->_M_value;
      goto LAB_00102613;
    }
    iVar6 = condition->_M_value;
  }
  local_40.m_cat = this->pc_;
  generic_category();
  local_50.m_cat = &generic_category::generic_category_const.super_error_category;
  local_50.m_val = iVar6;
LAB_00102613:
  bVar2 = operator==(&local_40,&local_50);
  return bVar2;
}

Assistant:

inline bool error_category::std_category::equivalent( int code,
      const std::error_condition & condition ) const BOOST_NOEXCEPT
    {
      if( default_error_condition( code ) == condition )
      {
        return true;
      }
      else if( condition.category() == std::generic_category()
        || condition.category() == boost::system::generic_category() )
      {
        boost::system::error_code bc( code, *pc_ );
        boost::system::error_condition bn( condition.value(),
          boost::system::generic_category() );

        return bc == bn;
      }
#ifndef BOOST_NO_RTTI
      else if( std_category const* pc2 = dynamic_cast< std_category const* >(
        &condition.category() ) )
      {
        boost::system::error_code bc( code, *pc_ );
        boost::system::error_condition bn( condition.value(), *pc2->pc_ );

        return bc == bn;
      }
#endif
      else
      {
        return false;
      }
    }